

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_arena_print(emitter_t *emitter,uint i,_Bool bins,_Bool large,_Bool mutex,_Bool extents)

{
  int iVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  emitter_type_t in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  size_t sz_34;
  size_t miblen_33;
  size_t mib_33 [7];
  size_t sz_33;
  size_t miblen_32;
  size_t mib_32 [7];
  size_t sz_32;
  size_t miblen_31;
  size_t mib_31 [7];
  size_t sz_31;
  size_t miblen_30;
  size_t mib_30 [7];
  size_t sz_30;
  size_t miblen_29;
  size_t mib_29 [7];
  size_t sz_29;
  size_t miblen_28;
  size_t mib_28 [7];
  size_t sz_28;
  size_t miblen_27;
  size_t mib_27 [7];
  size_t sz_27;
  size_t miblen_26;
  size_t mib_26 [7];
  emitter_col_t mem_count_val;
  emitter_col_t mem_count_title;
  emitter_row_t mem_count_row;
  size_t sz_26;
  size_t miblen_25;
  size_t mib_25 [7];
  size_t sz_25;
  size_t miblen_24;
  size_t mib_24 [7];
  size_t sz_24;
  size_t miblen_23;
  size_t mib_23 [7];
  size_t sz_23;
  size_t miblen_22;
  size_t mib_22 [7];
  size_t sz_22;
  size_t miblen_21;
  size_t mib_21 [7];
  size_t sz_21;
  size_t miblen_20;
  size_t mib_20 [7];
  size_t sz_20;
  size_t miblen_19;
  size_t mib_19 [7];
  size_t sz_19;
  size_t miblen_18;
  size_t mib_18 [7];
  size_t sz_18;
  size_t miblen_17;
  size_t mib_17 [7];
  size_t sz_17;
  size_t miblen_16;
  size_t mib_16 [7];
  size_t sz_16;
  size_t miblen_15;
  size_t mib_15 [7];
  size_t sz_15;
  size_t miblen_14;
  size_t mib_14 [7];
  emitter_col_t col_count_nflushes_ps;
  emitter_col_t col_count_nflushes;
  emitter_col_t col_count_nfills_ps;
  emitter_col_t col_count_nfills;
  emitter_col_t col_count_nrequests_ps;
  emitter_col_t col_count_nrequests;
  emitter_col_t col_count_ndalloc_ps;
  emitter_col_t col_count_ndalloc;
  emitter_col_t col_count_nmalloc_ps;
  emitter_col_t col_count_nmalloc;
  emitter_col_t col_count_allocated;
  emitter_col_t col_count_title;
  emitter_row_t alloc_count_row;
  emitter_col_t col_decay_purged;
  emitter_col_t col_decay_madvises;
  emitter_col_t col_decay_sweeps;
  emitter_col_t col_decay_npages;
  emitter_col_t col_decay_time;
  emitter_col_t col_decay_type;
  emitter_row_t decay_row;
  size_t sz_14;
  size_t miblen_13;
  size_t mib_13 [7];
  size_t sz_13;
  size_t miblen_12;
  size_t mib_12 [7];
  size_t sz_12;
  size_t miblen_11;
  size_t mib_11 [7];
  size_t sz_11;
  size_t miblen_10;
  size_t mib_10 [7];
  size_t sz_10;
  size_t miblen_9;
  size_t mib_9 [7];
  size_t sz_9;
  size_t miblen_8;
  size_t mib_8 [7];
  size_t sz_8;
  size_t miblen_7;
  size_t mib_7 [7];
  size_t sz_7;
  size_t miblen_6;
  size_t mib_6 [7];
  size_t sz_6;
  size_t miblen_5;
  size_t mib_5 [7];
  size_t sz_5;
  size_t miblen_4;
  size_t mib_4 [7];
  size_t sz_4;
  size_t miblen_3;
  size_t mib_3 [7];
  size_t sz_3;
  size_t miblen_2;
  size_t mib_2 [7];
  size_t sz_2;
  size_t miblen_1;
  size_t mib_1 [7];
  size_t sz_1;
  size_t miblen;
  size_t mib [7];
  size_t sz;
  uint64_t uptime;
  size_t tcache_bytes;
  uint64_t large_nflushes;
  uint64_t large_nfills;
  uint64_t large_nrequests;
  uint64_t large_ndalloc;
  uint64_t large_nmalloc;
  size_t large_allocated;
  uint64_t small_nflushes;
  uint64_t small_nfills;
  uint64_t small_nrequests;
  uint64_t small_ndalloc;
  uint64_t small_nmalloc;
  size_t small_allocated;
  uint64_t muzzy_purged;
  uint64_t muzzy_nmadvise;
  uint64_t muzzy_npurge;
  uint64_t dirty_purged;
  uint64_t dirty_nmadvise;
  uint64_t dirty_npurge;
  size_t extent_avail;
  size_t metadata_thp;
  size_t resident;
  size_t internal;
  size_t base;
  size_t retained;
  size_t mapped;
  size_t pmuzzy;
  size_t pdirty;
  size_t pactive;
  size_t page;
  ssize_t muzzy_decay_ms;
  ssize_t dirty_decay_ms;
  char *dss;
  uint nthreads;
  emitter_row_t *in_stack_fffffffffffff108;
  emitter_row_t *row;
  emitter_t *in_stack_fffffffffffff110;
  emitter_t *emitter_00;
  size_t *in_stack_fffffffffffff118;
  emitter_t *in_stack_fffffffffffff120;
  size_t in_stack_fffffffffffff128;
  size_t *in_stack_fffffffffffff130;
  uint64_t in_stack_fffffffffffff330;
  uint arena_ind;
  emitter_t *emitter_01;
  emitter_col_t local_c80;
  emitter_col_t local_c58;
  emitter_row_t local_c30;
  undefined8 local_c28;
  undefined8 local_c20;
  ulong local_c08;
  undefined8 local_bd8;
  undefined8 local_bd0;
  ulong local_bb8;
  undefined8 local_b88;
  undefined8 local_b80;
  ulong local_b68;
  undefined8 local_b38;
  undefined8 local_b30;
  ulong local_b18;
  undefined8 local_ae8;
  undefined8 local_ae0;
  ulong local_ac8;
  undefined8 local_a98;
  undefined8 local_a90;
  ulong local_a78;
  undefined8 local_a48;
  undefined8 local_a40;
  ulong local_a28;
  uint64_t in_stack_fffffffffffff5f0;
  uint in_stack_fffffffffffff5fc;
  emitter_t *in_stack_fffffffffffff600;
  uint in_stack_fffffffffffff64c;
  emitter_t *in_stack_fffffffffffff650;
  emitter_col_t local_868;
  emitter_col_t local_840;
  emitter_col_t local_818;
  emitter_col_t local_7f0;
  emitter_col_t local_7c8;
  emitter_col_t local_7a0;
  emitter_col_t local_778;
  emitter_col_t local_750;
  emitter_col_t local_728;
  emitter_col_t local_700;
  emitter_col_t local_6d8;
  emitter_col_t local_6b0;
  emitter_row_t local_688;
  emitter_col_t local_680;
  emitter_col_t local_658;
  emitter_col_t local_630;
  emitter_col_t local_608;
  emitter_col_t local_5e0;
  emitter_col_t local_5b8;
  emitter_row_t local_590;
  undefined8 local_588;
  undefined8 local_580;
  ulong local_568;
  undefined8 local_538;
  undefined8 local_530;
  ulong local_518;
  undefined8 local_4e8;
  undefined8 local_4e0;
  ulong local_4c8;
  undefined8 local_498;
  undefined8 local_490;
  ulong local_478;
  undefined8 local_448;
  undefined8 local_440;
  ulong local_428;
  undefined8 local_3f8;
  undefined8 local_3f0;
  ulong local_3d8;
  undefined8 local_3a8;
  undefined8 local_3a0;
  ulong local_388;
  undefined8 local_358;
  undefined8 local_350;
  ulong local_338;
  undefined8 local_308;
  undefined8 local_300;
  ulong local_2e8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  ulong local_298;
  undefined8 local_268;
  undefined8 local_260;
  ulong local_248;
  undefined8 local_218;
  undefined8 local_210;
  ulong local_1f8;
  undefined8 local_1c8;
  undefined8 local_1c0;
  ulong local_1a8;
  undefined8 local_178;
  undefined8 local_170;
  ulong local_158;
  undefined8 local_130;
  uint64_t local_128;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_120;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_c0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_b8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_b0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_a8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_a0;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_98;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_90;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_88;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_80;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_78;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_70;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_68;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_60;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_58;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_50;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_48;
  long local_40;
  long local_38;
  char *local_30;
  char *local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  emitter_type_t local_c;
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  local_130 = 8;
  local_c = in_ESI;
  iVar1 = je_mallctl((char *)in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                     (size_t *)in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                     CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.page");
    abort();
  }
  local_170 = 7;
  local_178 = 4;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.nthreads");
    abort();
  }
  local_158 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d081);
    abort();
  }
  emitter_kv(in_stack_fffffffffffff120,(char *)in_stack_fffffffffffff118,
             (char *)in_stack_fffffffffffff110,
             (emitter_type_t)((ulong)in_stack_fffffffffffff108 >> 0x20),
             (void *)CONCAT44(in_ESI,in_EDX));
  local_1c0 = 7;
  local_1c8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.uptime")
    ;
    abort();
  }
  local_1a8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d154);
    abort();
  }
  emitter_kv(in_stack_fffffffffffff120,(char *)in_stack_fffffffffffff118,
             (char *)in_stack_fffffffffffff110,
             (emitter_type_t)((ulong)in_stack_fffffffffffff108 >> 0x20),
             (void *)CONCAT44(in_ESI,in_EDX));
  local_210 = 7;
  local_218 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.dss");
    abort();
  }
  local_1f8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d227);
    abort();
  }
  emitter_kv(in_stack_fffffffffffff120,(char *)in_stack_fffffffffffff118,
             (char *)in_stack_fffffffffffff110,
             (emitter_type_t)((ulong)in_stack_fffffffffffff108 >> 0x20),
             (void *)CONCAT44(in_ESI,in_EDX));
  local_260 = 7;
  local_268 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.dirty_decay_ms");
    abort();
  }
  local_248 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d2fa);
    abort();
  }
  local_2b0 = 7;
  local_2b8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.muzzy_decay_ms");
    abort();
  }
  local_298 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d3a7);
    abort();
  }
  local_300 = 7;
  local_308 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.pactive"
                 );
    abort();
  }
  local_2e8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d454);
    abort();
  }
  local_350 = 7;
  local_358 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.pdirty")
    ;
    abort();
  }
  local_338 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d501);
    abort();
  }
  local_3a0 = 7;
  local_3a8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.pmuzzy")
    ;
    abort();
  }
  local_388 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d5ae);
    abort();
  }
  local_3f0 = 7;
  local_3f8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.dirty_npurge");
    abort();
  }
  local_3d8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d65b);
    abort();
  }
  local_440 = 7;
  local_448 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.dirty_nmadvise");
    abort();
  }
  local_428 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d708);
    abort();
  }
  local_490 = 7;
  local_498 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.dirty_purged");
    abort();
  }
  local_478 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d7b5);
    abort();
  }
  local_4e0 = 7;
  local_4e8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.muzzy_npurge");
    abort();
  }
  local_4c8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d862);
    abort();
  }
  local_530 = 7;
  local_538 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.muzzy_nmadvise");
    abort();
  }
  local_518 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d90f);
    abort();
  }
  local_580 = 7;
  local_588 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.muzzy_purged");
    abort();
  }
  local_568 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25d9bc);
    abort();
  }
  emitter_row_init(&local_590);
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  emitter_col_init(&local_5b8,&local_590);
  local_5b8.justify = emitter_justify_right;
  local_5b8.width = 9;
  local_5b8.type = emitter_type_title;
  local_5b8.field_3.str_val = "decaying:";
  emitter_col_init(&local_5e0,&local_590);
  local_5e0.justify = emitter_justify_right;
  local_5e0.width = 6;
  local_5e0.type = emitter_type_title;
  local_5e0.field_3.str_val = "time";
  emitter_col_init(&local_608,&local_590);
  local_608.justify = emitter_justify_right;
  local_608.width = 0xd;
  local_608.type = emitter_type_title;
  local_608.field_3.str_val = "npages";
  emitter_col_init(&local_630,&local_590);
  local_630.justify = emitter_justify_right;
  local_630.width = 0xd;
  local_630.type = emitter_type_title;
  local_630.field_3.str_val = "sweeps";
  emitter_col_init(&local_658,&local_590);
  local_658.justify = emitter_justify_right;
  local_658.width = 0xd;
  local_658.type = emitter_type_title;
  local_658.field_3.str_val = "madvises";
  emitter_col_init(&local_680,&local_590);
  local_680.justify = emitter_justify_right;
  local_680.width = 0xd;
  local_680.type = emitter_type_title;
  local_680.field_3.str_val = "purged";
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_5b8.field_3.str_val = "dirty:";
  if ((long)local_28 < 0) {
    local_5e0.type = emitter_type_title;
    local_5e0.field_3.str_val = "N/A";
  }
  else {
    local_5e0.type = emitter_type_ssize;
    local_5e0.field_3.str_val = local_28;
  }
  local_608.type = emitter_type_size;
  local_608.field_3 = local_48;
  local_630.type = emitter_type_uint64;
  local_630.field_3 = local_90;
  local_658.type = emitter_type_uint64;
  local_658.field_3 = local_98;
  local_680.type = emitter_type_uint64;
  local_680.field_3 = local_a0;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_5b8.field_3.str_val = "muzzy:";
  if ((long)local_30 < 0) {
    local_5e0.type = emitter_type_title;
    local_5e0.field_3.str_val = "N/A";
  }
  else {
    local_5e0.type = emitter_type_ssize;
    local_5e0.field_3.str_val = local_30;
  }
  local_608.type = emitter_type_size;
  local_608.field_3 = local_50;
  local_630.type = emitter_type_uint64;
  local_630.field_3 = local_a8;
  local_658.type = emitter_type_uint64;
  local_658.field_3 = local_b0;
  local_680.type = emitter_type_uint64;
  local_680.field_3 = local_b8;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  emitter_row_init(&local_688);
  emitter_col_init(&local_6b0,&local_688);
  local_6b0.justify = emitter_justify_left;
  local_6b0.width = 0x15;
  local_6b0.type = emitter_type_title;
  local_6b0.field_3.str_val = "";
  emitter_col_init(&local_6d8,&local_688);
  local_6d8.justify = emitter_justify_right;
  local_6d8.width = 0x10;
  local_6d8.type = emitter_type_title;
  local_6d8.field_3.str_val = "allocated";
  emitter_col_init(&local_700,&local_688);
  local_700.justify = emitter_justify_right;
  local_700.width = 0x10;
  local_700.type = emitter_type_title;
  local_700.field_3.str_val = "nmalloc";
  emitter_col_init(&local_728,&local_688);
  local_728.justify = emitter_justify_right;
  local_728.width = 8;
  local_728.type = emitter_type_title;
  local_728.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_750,&local_688);
  local_750.justify = emitter_justify_right;
  local_750.width = 0x10;
  local_750.type = emitter_type_title;
  local_750.field_3.str_val = "ndalloc";
  emitter_col_init(&local_778,&local_688);
  local_778.justify = emitter_justify_right;
  local_778.width = 8;
  local_778.type = emitter_type_title;
  local_778.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_7a0,&local_688);
  local_7a0.justify = emitter_justify_right;
  local_7a0.width = 0x10;
  local_7a0.type = emitter_type_title;
  local_7a0.field_3.str_val = "nrequests";
  emitter_col_init(&local_7c8,&local_688);
  local_7c8.justify = emitter_justify_right;
  local_7c8.width = 10;
  local_7c8.type = emitter_type_title;
  local_7c8.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_7f0,&local_688);
  local_7f0.justify = emitter_justify_right;
  local_7f0.width = 0x10;
  local_7f0.type = emitter_type_title;
  local_7f0.field_3.str_val = "nfill";
  emitter_col_init(&local_818,&local_688);
  local_818.justify = emitter_justify_right;
  local_818.width = 10;
  local_818.type = emitter_type_title;
  local_818.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_840,&local_688);
  local_840.justify = emitter_justify_right;
  local_840.width = 0x10;
  local_840.type = emitter_type_title;
  local_840.field_3.str_val = "nflush";
  emitter_col_init(&local_868,&local_688);
  local_868.justify = emitter_justify_right;
  local_868.width = 10;
  local_868.type = emitter_type_title;
  local_868.field_3.str_val = "(#/sec)";
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_728.type = emitter_type_uint64;
  local_778.type = emitter_type_uint64;
  local_7c8.type = emitter_type_uint64;
  local_818.type = emitter_type_uint64;
  local_868.type = emitter_type_uint64;
  emitter_json_object_kv_begin((emitter_t *)CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,in_R8D))
  ;
  local_6b0.field_3.str_val = "small:";
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.small.allocated");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e2ee);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_6d8.type = emitter_type_size;
  local_6d8.field_3 = local_c0;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.small.nmalloc");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e3d5);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_700.type = emitter_type_uint64;
  local_700.field_3.uint64_val = local_c8;
  local_728.field_3.uint64_val = rate_per_second(local_c8,local_128);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.small.ndalloc");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e4d9);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_750.type = emitter_type_uint64;
  local_750.field_3.uint64_val = local_d0;
  local_778.field_3.uint64_val = rate_per_second(local_d0,local_128);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.small.nrequests");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e5dd);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_7a0.type = emitter_type_uint64;
  local_7a0.field_3.uint64_val = local_d8;
  local_7c8.field_3.uint64_val = rate_per_second(local_d8,local_128);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.small.nfills");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e6e1);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_7f0.type = emitter_type_uint64;
  local_7f0.field_3.uint64_val = local_e0;
  local_818.field_3.uint64_val = rate_per_second(local_e0,local_128);
  local_a40 = 7;
  local_a48 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.small.nflushes");
    abort();
  }
  local_a28 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e7e5);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_840.type = emitter_type_uint64;
  local_840.field_3.uint64_val = local_e8;
  local_868.field_3.uint64_val = rate_per_second(local_e8,local_128);
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  emitter_json_object_end((emitter_t *)0x25e869);
  emitter_json_object_kv_begin((emitter_t *)CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,in_R8D))
  ;
  local_6b0.field_3.str_val = "large:";
  local_a90 = 7;
  local_a98 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.large.allocated");
    abort();
  }
  local_a78 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25e92e);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_6d8.type = emitter_type_size;
  local_6d8.field_3 = local_f0;
  local_ae0 = 7;
  local_ae8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.large.nmalloc");
    abort();
  }
  local_ac8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25ea15);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_700.type = emitter_type_uint64;
  local_700.field_3.uint64_val = local_f8;
  local_728.field_3.uint64_val = rate_per_second(local_f8,local_128);
  local_b30 = 7;
  local_b38 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.large.ndalloc");
    abort();
  }
  local_b18 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25eb19);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_750.type = emitter_type_uint64;
  local_750.field_3.uint64_val = local_100;
  local_778.field_3.uint64_val = rate_per_second(local_100,local_128);
  local_b80 = 7;
  local_b88 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.large.nrequests");
    abort();
  }
  local_b68 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25ec1d);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_7a0.type = emitter_type_uint64;
  local_7a0.field_3.uint64_val = local_108;
  local_7c8.field_3.uint64_val = rate_per_second(local_108,local_128);
  local_bd0 = 7;
  local_bd8 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.large.nfills");
    abort();
  }
  local_bb8 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25ed21);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_7f0.type = emitter_type_uint64;
  local_7f0.field_3.uint64_val = local_110;
  local_818.field_3.uint64_val = rate_per_second(local_110,local_128);
  local_c20 = 7;
  local_c28 = 8;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.large.nflushes");
    abort();
  }
  local_c08 = (ulong)local_c;
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25ee25);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_840.type = emitter_type_uint64;
  local_840.field_3.uint64_val = local_118;
  local_868.field_3.uint64_val = rate_per_second(local_118,local_128);
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  emitter_json_object_end((emitter_t *)0x25eea9);
  local_6b0.field_3.str_val = "total:";
  local_6d8.field_3.uint64_val = (uint64_t)(local_c0.str_val + local_f0.uint64_val);
  local_700.field_3.str_val = (char *)(local_c8 + local_f8);
  local_750.field_3.str_val = (char *)(local_d0 + local_100);
  local_7a0.field_3.str_val = (char *)(local_d8 + local_108);
  local_7f0.field_3.str_val = (char *)(local_e0 + local_110);
  local_840.field_3.str_val = (char *)(local_e8 + local_118);
  local_728.field_3.uint64_val = rate_per_second(local_700.field_3.uint64_val,local_128);
  local_778.field_3.uint64_val = rate_per_second(local_750.field_3.uint64_val,local_128);
  local_7c8.field_3.uint64_val = rate_per_second(local_7a0.field_3.uint64_val,local_128);
  local_818.field_3.uint64_val = rate_per_second(local_7f0.field_3.uint64_val,local_128);
  local_868.field_3.uint64_val = rate_per_second(local_840.field_3.uint64_val,local_128);
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  emitter_row_init(&local_c30);
  emitter_col_init(&local_c58,&local_c30);
  local_c58.justify = emitter_justify_left;
  local_c58.width = 0x15;
  local_c58.type = emitter_type_title;
  local_c58.field_3.str_val = "";
  emitter_col_init(&local_c80,&local_c30);
  local_c80.justify = emitter_justify_right;
  local_c80.width = 0x10;
  local_c80.type = emitter_type_title;
  local_c80.field_3.str_val = "";
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  local_c80.type = emitter_type_size;
  local_c58.field_3.str_val = "active:";
  local_c80.field_3.uint64_val = local_40 * local_38;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  emitter_01 = (emitter_t *)0x7;
  arena_ind = 0;
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.mapped")
    ;
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f184);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "mapped:";
  local_c80.field_3 = local_58;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.retained");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f284);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "retained:";
  local_c80.field_3 = local_60;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n","stats.arenas.0.base");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f384);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "base:";
  local_c80.field_3 = local_68;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.internal");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f484);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "internal:";
  local_c80.field_3 = local_70;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.metadata_thp");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f584);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "metadata_thp:";
  local_c80.field_3 = local_80;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.tcache_bytes");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f684);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "tcache_bytes:";
  local_c80.field_3 = local_120;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  iVar1 = je_mallctlnametomib((char *)in_stack_fffffffffffff110,(size_t *)in_stack_fffffffffffff108,
                              (size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.resident");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                          in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                          in_stack_fffffffffffff110,(size_t)in_stack_fffffffffffff108);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f76f);
    abort();
  }
  emitter_json_kv(in_stack_fffffffffffff110,(char *)in_stack_fffffffffffff108,in_ESI,
                  (void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "resident:";
  local_c80.field_3 = local_78;
  emitter_table_row(in_stack_fffffffffffff110,in_stack_fffffffffffff108);
  emitter_00 = (emitter_t *)0x7;
  row = (emitter_row_t *)0x8;
  iVar1 = je_mallctlnametomib((char *)0x7,(size_t *)0x8,(size_t *)CONCAT44(in_ESI,in_EDX));
  if (iVar1 != 0) {
    malloc_printf("<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n",
                  "stats.arenas.0.extent_avail");
    abort();
  }
  iVar1 = je_mallctlbymib(in_stack_fffffffffffff130,(ulong)local_c,in_stack_fffffffffffff120,
                          in_stack_fffffffffffff118,emitter_00,(size_t)row);
  if (iVar1 != 0) {
    malloc_write((char *)0x25f857);
    abort();
  }
  emitter_json_kv(emitter_00,(char *)row,in_ESI,(void *)CONCAT44(in_ECX,in_R8D));
  local_c58.field_3.str_val = "extent_avail:";
  local_c80.field_3 = local_88;
  emitter_table_row(emitter_00,row);
  if ((local_f & 1) != 0) {
    stats_arena_mutexes_print(emitter_01,arena_ind,in_stack_fffffffffffff330);
  }
  if ((local_d & 1) != 0) {
    stats_arena_bins_print((emitter_t *)mib_29[0],miblen_29._7_1_,(uint)miblen_29,sz_30);
  }
  if ((local_e & 1) != 0) {
    stats_arena_lextents_print
              (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f0);
  }
  if ((local_10 & 1) != 0) {
    stats_arena_extents_print(in_stack_fffffffffffff650,in_stack_fffffffffffff64c);
  }
  return;
}

Assistant:

static void
stats_arena_print(emitter_t *emitter, unsigned i, bool bins, bool large,
    bool mutex, bool extents) {
	unsigned nthreads;
	const char *dss;
	ssize_t dirty_decay_ms, muzzy_decay_ms;
	size_t page, pactive, pdirty, pmuzzy, mapped, retained;
	size_t base, internal, resident, metadata_thp, extent_avail;
	uint64_t dirty_npurge, dirty_nmadvise, dirty_purged;
	uint64_t muzzy_npurge, muzzy_nmadvise, muzzy_purged;
	size_t small_allocated;
	uint64_t small_nmalloc, small_ndalloc, small_nrequests, small_nfills,
	    small_nflushes;
	size_t large_allocated;
	uint64_t large_nmalloc, large_ndalloc, large_nrequests, large_nfills,
	    large_nflushes;
	size_t tcache_bytes;
	uint64_t uptime;

	CTL_GET("arenas.page", &page, size_t);

	CTL_M2_GET("stats.arenas.0.nthreads", i, &nthreads, unsigned);
	emitter_kv(emitter, "nthreads", "assigned threads",
	    emitter_type_unsigned, &nthreads);

	CTL_M2_GET("stats.arenas.0.uptime", i, &uptime, uint64_t);
	emitter_kv(emitter, "uptime_ns", "uptime", emitter_type_uint64,
	    &uptime);

	CTL_M2_GET("stats.arenas.0.dss", i, &dss, const char *);
	emitter_kv(emitter, "dss", "dss allocation precedence",
	    emitter_type_string, &dss);

	CTL_M2_GET("stats.arenas.0.dirty_decay_ms", i, &dirty_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.muzzy_decay_ms", i, &muzzy_decay_ms,
	    ssize_t);
	CTL_M2_GET("stats.arenas.0.pactive", i, &pactive, size_t);
	CTL_M2_GET("stats.arenas.0.pdirty", i, &pdirty, size_t);
	CTL_M2_GET("stats.arenas.0.pmuzzy", i, &pmuzzy, size_t);
	CTL_M2_GET("stats.arenas.0.dirty_npurge", i, &dirty_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_nmadvise", i, &dirty_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.dirty_purged", i, &dirty_purged, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_npurge", i, &muzzy_npurge, uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_nmadvise", i, &muzzy_nmadvise,
	    uint64_t);
	CTL_M2_GET("stats.arenas.0.muzzy_purged", i, &muzzy_purged, uint64_t);

	emitter_row_t decay_row;
	emitter_row_init(&decay_row);

	/* JSON-style emission. */
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize,
	    &dirty_decay_ms);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize,
	    &muzzy_decay_ms);

	emitter_json_kv(emitter, "pactive", emitter_type_size, &pactive);
	emitter_json_kv(emitter, "pdirty", emitter_type_size, &pdirty);
	emitter_json_kv(emitter, "pmuzzy", emitter_type_size, &pmuzzy);

	emitter_json_kv(emitter, "dirty_npurge", emitter_type_uint64,
	    &dirty_npurge);
	emitter_json_kv(emitter, "dirty_nmadvise", emitter_type_uint64,
	    &dirty_nmadvise);
	emitter_json_kv(emitter, "dirty_purged", emitter_type_uint64,
	    &dirty_purged);

	emitter_json_kv(emitter, "muzzy_npurge", emitter_type_uint64,
	    &muzzy_npurge);
	emitter_json_kv(emitter, "muzzy_nmadvise", emitter_type_uint64,
	    &muzzy_nmadvise);
	emitter_json_kv(emitter, "muzzy_purged", emitter_type_uint64,
	    &muzzy_purged);

	/* Table-style emission. */
	COL(decay_row, decay_type, right, 9, title);
	col_decay_type.str_val = "decaying:";

	COL(decay_row, decay_time, right, 6, title);
	col_decay_time.str_val = "time";

	COL(decay_row, decay_npages, right, 13, title);
	col_decay_npages.str_val = "npages";

	COL(decay_row, decay_sweeps, right, 13, title);
	col_decay_sweeps.str_val = "sweeps";

	COL(decay_row, decay_madvises, right, 13, title);
	col_decay_madvises.str_val = "madvises";

	COL(decay_row, decay_purged, right, 13, title);
	col_decay_purged.str_val = "purged";

	/* Title row. */
	emitter_table_row(emitter, &decay_row);

	/* Dirty row. */
	col_decay_type.str_val = "dirty:";

	if (dirty_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = dirty_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pdirty;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = dirty_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = dirty_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = dirty_purged;

	emitter_table_row(emitter, &decay_row);

	/* Muzzy row. */
	col_decay_type.str_val = "muzzy:";

	if (muzzy_decay_ms >= 0) {
		col_decay_time.type = emitter_type_ssize;
		col_decay_time.ssize_val = muzzy_decay_ms;
	} else {
		col_decay_time.type = emitter_type_title;
		col_decay_time.str_val = "N/A";
	}

	col_decay_npages.type = emitter_type_size;
	col_decay_npages.size_val = pmuzzy;

	col_decay_sweeps.type = emitter_type_uint64;
	col_decay_sweeps.uint64_val = muzzy_npurge;

	col_decay_madvises.type = emitter_type_uint64;
	col_decay_madvises.uint64_val = muzzy_nmadvise;

	col_decay_purged.type = emitter_type_uint64;
	col_decay_purged.uint64_val = muzzy_purged;

	emitter_table_row(emitter, &decay_row);

	/* Small / large / total allocation counts. */
	emitter_row_t alloc_count_row;
	emitter_row_init(&alloc_count_row);

	COL(alloc_count_row, count_title, left, 21, title);
	col_count_title.str_val = "";

	COL(alloc_count_row, count_allocated, right, 16, title);
	col_count_allocated.str_val = "allocated";

	COL(alloc_count_row, count_nmalloc, right, 16, title);
	col_count_nmalloc.str_val = "nmalloc";
	COL(alloc_count_row, count_nmalloc_ps, right, 8, title);
	col_count_nmalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_ndalloc, right, 16, title);
	col_count_ndalloc.str_val = "ndalloc";
	COL(alloc_count_row, count_ndalloc_ps, right, 8, title);
	col_count_ndalloc_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nrequests, right, 16, title);
	col_count_nrequests.str_val = "nrequests";
	COL(alloc_count_row, count_nrequests_ps, right, 10, title);
	col_count_nrequests_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nfills, right, 16, title);
	col_count_nfills.str_val = "nfill";
	COL(alloc_count_row, count_nfills_ps, right, 10, title);
	col_count_nfills_ps.str_val = "(#/sec)";

	COL(alloc_count_row, count_nflushes, right, 16, title);
	col_count_nflushes.str_val = "nflush";
	COL(alloc_count_row, count_nflushes_ps, right, 10, title);
	col_count_nflushes_ps.str_val = "(#/sec)";

	emitter_table_row(emitter, &alloc_count_row);

	col_count_nmalloc_ps.type = emitter_type_uint64;
	col_count_ndalloc_ps.type = emitter_type_uint64;
	col_count_nrequests_ps.type = emitter_type_uint64;
	col_count_nfills_ps.type = emitter_type_uint64;
	col_count_nflushes_ps.type = emitter_type_uint64;

#define GET_AND_EMIT_ALLOC_STAT(small_or_large, name, valtype)		\
	CTL_M2_GET("stats.arenas.0." #small_or_large "." #name, i,	\
	    &small_or_large##_##name, valtype##_t);			\
	emitter_json_kv(emitter, #name, emitter_type_##valtype,		\
	    &small_or_large##_##name);					\
	col_count_##name.type = emitter_type_##valtype;		\
	col_count_##name.valtype##_val = small_or_large##_##name;

	emitter_json_object_kv_begin(emitter, "small");
	col_count_title.str_val = "small:";

	GET_AND_EMIT_ALLOC_STAT(small, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(small, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(small, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "small". */

	emitter_json_object_kv_begin(emitter, "large");
	col_count_title.str_val = "large:";

	GET_AND_EMIT_ALLOC_STAT(large, allocated, size)
	GET_AND_EMIT_ALLOC_STAT(large, nmalloc, uint64)
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, ndalloc, uint64)
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nrequests, uint64)
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nfills, uint64)
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	GET_AND_EMIT_ALLOC_STAT(large, nflushes, uint64)
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);

	emitter_table_row(emitter, &alloc_count_row);
	emitter_json_object_end(emitter); /* Close "large". */

#undef GET_AND_EMIT_ALLOC_STAT

	/* Aggregated small + large stats are emitter only in table mode. */
	col_count_title.str_val = "total:";
	col_count_allocated.size_val = small_allocated + large_allocated;
	col_count_nmalloc.uint64_val = small_nmalloc + large_nmalloc;
	col_count_ndalloc.uint64_val = small_ndalloc + large_ndalloc;
	col_count_nrequests.uint64_val = small_nrequests + large_nrequests;
	col_count_nfills.uint64_val = small_nfills + large_nfills;
	col_count_nflushes.uint64_val = small_nflushes + large_nflushes;
	col_count_nmalloc_ps.uint64_val =
	    rate_per_second(col_count_nmalloc.uint64_val, uptime);
	col_count_ndalloc_ps.uint64_val =
	    rate_per_second(col_count_ndalloc.uint64_val, uptime);
	col_count_nrequests_ps.uint64_val =
	    rate_per_second(col_count_nrequests.uint64_val, uptime);
	col_count_nfills_ps.uint64_val =
	    rate_per_second(col_count_nfills.uint64_val, uptime);
	col_count_nflushes_ps.uint64_val =
	    rate_per_second(col_count_nflushes.uint64_val, uptime);
	emitter_table_row(emitter, &alloc_count_row);

	emitter_row_t mem_count_row;
	emitter_row_init(&mem_count_row);

	emitter_col_t mem_count_title;
	emitter_col_init(&mem_count_title, &mem_count_row);
	mem_count_title.justify = emitter_justify_left;
	mem_count_title.width = 21;
	mem_count_title.type = emitter_type_title;
	mem_count_title.str_val = "";

	emitter_col_t mem_count_val;
	emitter_col_init(&mem_count_val, &mem_count_row);
	mem_count_val.justify = emitter_justify_right;
	mem_count_val.width = 16;
	mem_count_val.type = emitter_type_title;
	mem_count_val.str_val = "";

	emitter_table_row(emitter, &mem_count_row);
	mem_count_val.type = emitter_type_size;

	/* Active count in bytes is emitted only in table mode. */
	mem_count_title.str_val = "active:";
	mem_count_val.size_val = pactive * page;
	emitter_table_row(emitter, &mem_count_row);

#define GET_AND_EMIT_MEM_STAT(stat)					\
	CTL_M2_GET("stats.arenas.0."#stat, i, &stat, size_t);		\
	emitter_json_kv(emitter, #stat, emitter_type_size, &stat);	\
	mem_count_title.str_val = #stat":";				\
	mem_count_val.size_val = stat;					\
	emitter_table_row(emitter, &mem_count_row);

	GET_AND_EMIT_MEM_STAT(mapped)
	GET_AND_EMIT_MEM_STAT(retained)
	GET_AND_EMIT_MEM_STAT(base)
	GET_AND_EMIT_MEM_STAT(internal)
	GET_AND_EMIT_MEM_STAT(metadata_thp)
	GET_AND_EMIT_MEM_STAT(tcache_bytes)
	GET_AND_EMIT_MEM_STAT(resident)
	GET_AND_EMIT_MEM_STAT(extent_avail)
#undef GET_AND_EMIT_MEM_STAT

	if (mutex) {
		stats_arena_mutexes_print(emitter, i, uptime);
	}
	if (bins) {
		stats_arena_bins_print(emitter, mutex, i, uptime);
	}
	if (large) {
		stats_arena_lextents_print(emitter, i, uptime);
	}
	if (extents) {
		stats_arena_extents_print(emitter, i);
	}
}